

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
          (FactoredQLastTimeStepOrElse *this,void **vtt,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QFunctionJAOHInterface QVar1;
  
  FactoredQFunctionStateJAOHInterface::FactoredQFunctionStateJAOHInterface
            (&this->super_FactoredQFunctionStateJAOHInterface,vtt + 1);
  QFunctionForFactoredDecPOMDP::QFunctionForFactoredDecPOMDP
            (&this->super_QFunctionForFactoredDecPOMDP,vtt + 7,puf);
  QVar1 = (QFunctionJAOHInterface)*vtt;
  (this->super_FactoredQFunctionStateJAOHInterface).super_QFunctionJAOHInterface = QVar1;
  *(void **)(&(this->super_FactoredQFunctionStateJAOHInterface).super_QFunctionJAOHInterface.
              field_0x0 + *(long *)((long)QVar1 + -0x80)) = vtt[0xb];
  *(void **)(&(this->super_FactoredQFunctionStateJAOHInterface).super_QFunctionJAOHInterface.
              field_0x0 +
            *(long *)((long)(this->super_FactoredQFunctionStateJAOHInterface).
                            super_QFunctionJAOHInterface + -0x60)) = vtt[0xc];
  *(void **)&this->super_QFunctionForFactoredDecPOMDP = vtt[0xd];
  *(void **)(&(this->super_FactoredQFunctionStateJAOHInterface).super_QFunctionJAOHInterface.
              field_0x0 +
            *(long *)((long)(this->super_FactoredQFunctionStateJAOHInterface).
                            super_QFunctionJAOHInterface + -0x88)) = vtt[0xe];
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_m_initialized = false;
  return;
}

Assistant:

FactoredQLastTimeStepOrElse::
FactoredQLastTimeStepOrElse(const PlanningUnitFactoredDecPOMDPDiscrete *puf) :
    QFunctionForFactoredDecPOMDP(puf)
{
    _m_initialized = false;
}